

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O2

void __thiscall Function_Pool::FunctionPoolTask::~FunctionPoolTask(FunctionPoolTask *this)

{
  (this->super_TaskProviderSingleton).super_AbstractTaskProvider._vptr_AbstractTaskProvider =
       (_func_int **)&PTR__FunctionPoolTask_0012ed40;
  std::
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>::
  ~unique_ptr(&this->_infoOut);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr(&this->_infoIn2);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr(&this->_infoIn1);
  TaskProviderSingleton::~TaskProviderSingleton(&this->super_TaskProviderSingleton);
  return;
}

Assistant:

FunctionPoolTask::~FunctionPoolTask()
    {
    }